

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O2

int64_t number_from_bin(char *s,uint32_t len)

{
  int64_t iVar1;
  ulong uVar2;
  
  if (len < 0x41) {
    iVar1 = 0;
    for (uVar2 = 0; len != uVar2; uVar2 = uVar2 + 1) {
      iVar1 = (long)s[uVar2] + iVar1 * 2 + -0x30;
    }
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int64_t number_from_bin (const char *s, uint32_t len) {
    // LLONG_MIN  = -9223372036854775808
    // LLONG_MAX  = +9223372036854775807
    // BIN(9223372036854775808) = 11010001101101110001011101011000111000100001100101
    
    // sanity check on len
    if (len > 64) return 0;
    int64_t value = 0;
    for (uint32_t i=0; i<len; ++i) {
        int c = s[i];
        value = (value << 1) + (c - '0');
    }
    return value;
}